

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5IndexTombstoneRehash
              (Fts5Index *p,Fts5StructureSegment *pSeg,Fts5Data *pData1,int iPg1,int szKey,int nOut,
              Fts5Data **apOut)

{
  bool bVar1;
  u32 uVar2;
  int in_ECX;
  Fts5Data *in_RDX;
  long in_RSI;
  undefined1 in_R8B;
  int in_R9D;
  undefined8 *in_stack_00000008;
  Fts5Data *pPg;
  u64 *aSlot_1;
  u32 *aSlot;
  u64 iVal;
  int iIn;
  int nSlotIn;
  int szKeyIn;
  Fts5Data *pFree;
  Fts5Data *pData;
  int res;
  int ii;
  u64 iRowid;
  int in_stack_ffffffffffffffb0;
  int bForce;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Fts5Data *local_38;
  int local_2c;
  int local_28;
  
  local_2c = 0;
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    **(undefined1 **)in_stack_00000008[local_28] = in_R8B;
    fts5PutU32((u8 *)(*(long *)in_stack_00000008[local_28] + 4),0);
  }
  local_28 = 0;
  do {
    bVar1 = false;
    if (local_2c == 0) {
      bVar1 = local_28 < *(int *)(in_RSI + 0x20);
    }
    if (!bVar1) {
      return local_2c;
    }
    local_38 = in_RDX;
    if (in_ECX != local_28) {
      local_38 = fts5DataRead((Fts5Index *)0x0,
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    if (local_38 != (Fts5Data *)0x0) {
      in_stack_ffffffffffffffbc = 8;
      if (*local_38->p == '\x04') {
        in_stack_ffffffffffffffbc = 4;
      }
      in_stack_ffffffffffffffb8 = (local_38->nn + -8) / in_stack_ffffffffffffffbc;
      for (bForce = 0; bForce < in_stack_ffffffffffffffb8; bForce = bForce + 1) {
        iRowid = 0;
        if (in_stack_ffffffffffffffbc == 4) {
          if (*(int *)(local_38->p + (long)bForce * 4 + 8) != 0) {
            uVar2 = fts5GetU32(local_38->p + (long)bForce * 4 + 8);
            iRowid = (u64)uVar2;
          }
        }
        else if (*(long *)(local_38->p + (long)bForce * 8 + 8) != 0) {
          iRowid = fts5GetU64(local_38->p + (long)bForce * 8 + 8);
        }
        if ((iRowid != 0) &&
           (local_2c = fts5IndexTombstoneAddToPage
                                 ((Fts5Data *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                  bForce,in_stack_ffffffffffffffb0,iRowid), local_2c != 0)) break;
      }
      if (local_28 == 0) {
        *(u8 *)(*(long *)*in_stack_00000008 + 1) = local_38->p[1];
      }
    }
    fts5DataRelease((Fts5Data *)0x28c8a3);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static int fts5IndexTombstoneRehash(
  Fts5Index *p,
  Fts5StructureSegment *pSeg,     /* Segment to rebuild hash of */
  Fts5Data *pData1,               /* One page of current hash - or NULL */
  int iPg1,                       /* Which page of the current hash is pData1 */
  int szKey,                      /* 4 or 8, the keysize */
  int nOut,                       /* Number of output pages */
  Fts5Data **apOut                /* Array of output hash pages */
){
  int ii;
  int res = 0;

  /* Initialize the headers of all the output pages */
  for(ii=0; ii<nOut; ii++){
    apOut[ii]->p[0] = szKey;
    fts5PutU32(&apOut[ii]->p[4], 0);
  }

  /* Loop through the current pages of the hash table. */
  for(ii=0; res==0 && ii<pSeg->nPgTombstone; ii++){
    Fts5Data *pData = 0;          /* Page ii of the current hash table */
    Fts5Data *pFree = 0;          /* Free this at the end of the loop */

    if( iPg1==ii ){
      pData = pData1;
    }else{
      pFree = pData = fts5DataRead(p, FTS5_TOMBSTONE_ROWID(pSeg->iSegid, ii));
    }

    if( pData ){
      int szKeyIn = TOMBSTONE_KEYSIZE(pData);
      int nSlotIn = (pData->nn - 8) / szKeyIn;
      int iIn;
      for(iIn=0; iIn<nSlotIn; iIn++){
        u64 iVal = 0;

        /* Read the value from slot iIn of the input page into iVal. */
        if( szKeyIn==4 ){
          u32 *aSlot = (u32*)&pData->p[8];
          if( aSlot[iIn] ) iVal = fts5GetU32((u8*)&aSlot[iIn]);
        }else{
          u64 *aSlot = (u64*)&pData->p[8];
          if( aSlot[iIn] ) iVal = fts5GetU64((u8*)&aSlot[iIn]);
        }

        /* If iVal is not 0 at this point, insert it into the new hash table */
        if( iVal ){
          Fts5Data *pPg = apOut[(iVal % nOut)];
          res = fts5IndexTombstoneAddToPage(pPg, 0, nOut, iVal);
          if( res ) break;
        }
      }

      /* If this is page 0 of the old hash, copy the rowid-0-flag from the
      ** old hash to the new.  */
      if( ii==0 ){
        apOut[0]->p[1] = pData->p[1];
      }
    }
    fts5DataRelease(pFree);
  }

  return res;
}